

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O1

string * llama_model_ftype_name_abi_cxx11_(string *__return_storage_ptr__,llama_ftype ftype)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  char *pcVar4;
  char *pcVar5;
  string local_30;
  
  if ((ftype >> 10 & 1) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    switch(ftype) {
    case LLAMA_FTYPE_ALL_F32:
      pcVar5 = "all F32";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_F16:
      pcVar5 = "F16";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_Q4_0:
      pcVar5 = "Q4_0";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_Q4_1:
      pcVar5 = "Q4_1";
      pcVar4 = "";
      break;
    default:
      pcVar5 = "unknown, may not work";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_Q8_0:
      pcVar5 = "Q8_0";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_Q5_0:
      pcVar5 = "Q5_0";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_Q5_1:
      pcVar5 = "Q5_1";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_Q2_K:
      pcVar5 = "Q2_K - Medium";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_Q3_K_S:
      pcVar5 = "Q3_K - Small";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_Q3_K_M:
      pcVar5 = "Q3_K - Medium";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_Q3_K_L:
      pcVar5 = "Q3_K - Large";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_Q4_K_S:
      pcVar5 = "Q4_K - Small";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_Q4_K_M:
      pcVar5 = "Q4_K - Medium";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_Q5_K_S:
      pcVar5 = "Q5_K - Small";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_Q5_K_M:
      pcVar5 = "Q5_K - Medium";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_Q6_K:
      pcVar5 = "Q6_K";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ2_XXS:
      pcVar5 = "IQ2_XXS - 2.0625 bpw";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ2_XS:
      pcVar5 = "IQ2_XS - 2.3125 bpw";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_Q2_K_S:
      pcVar5 = "Q2_K - Small";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ3_XS:
      pcVar5 = "IQ3_XS - 3.3 bpw";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ3_XXS:
      pcVar5 = "IQ3_XXS - 3.0625 bpw";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ1_S:
      pcVar5 = "IQ1_S - 1.5625 bpw";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ4_NL:
      pcVar5 = "IQ4_NL - 4.5 bpw";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ3_S:
      pcVar5 = "IQ3_S - 3.4375 bpw";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ3_M:
      pcVar5 = "IQ3_S mix - 3.66 bpw";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ2_S:
      pcVar5 = "IQ2_S - 2.5 bpw";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ2_M:
      pcVar5 = "IQ2_M - 2.7 bpw";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ4_XS:
      pcVar5 = "IQ4_XS - 4.25 bpw";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ1_M:
      pcVar5 = "IQ1_M - 1.75 bpw";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_BF16:
      pcVar5 = "BF16";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_TQ1_0:
      pcVar5 = "TQ1_0 - 1.69 bpw ternary";
      pcVar4 = "";
      break;
    case LLAMA_FTYPE_MOSTLY_TQ2_0:
      pcVar5 = "TQ2_0 - 2.06 bpw ternary";
      pcVar4 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  }
  else {
    llama_model_ftype_name_abi_cxx11_(&local_30,ftype & ~LLAMA_FTYPE_GUESSED);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar3) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string llama_model_ftype_name(llama_ftype ftype) {
    if (ftype & LLAMA_FTYPE_GUESSED) {
        return llama_model_ftype_name((enum llama_ftype) (ftype & ~LLAMA_FTYPE_GUESSED)) + " (guessed)";
    }

    switch (ftype) {
        case LLAMA_FTYPE_ALL_F32:         return "all F32";
        case LLAMA_FTYPE_MOSTLY_F16:      return "F16";
        case LLAMA_FTYPE_MOSTLY_BF16:     return "BF16";
        case LLAMA_FTYPE_MOSTLY_Q4_0:     return "Q4_0";
        case LLAMA_FTYPE_MOSTLY_Q4_1:     return "Q4_1";
        case LLAMA_FTYPE_MOSTLY_Q5_0:     return "Q5_0";
        case LLAMA_FTYPE_MOSTLY_Q5_1:     return "Q5_1";
        case LLAMA_FTYPE_MOSTLY_Q8_0:     return "Q8_0";
        case LLAMA_FTYPE_MOSTLY_Q2_K:     return "Q2_K - Medium";
        case LLAMA_FTYPE_MOSTLY_Q2_K_S:   return "Q2_K - Small";
        case LLAMA_FTYPE_MOSTLY_Q3_K_S:   return "Q3_K - Small";
        case LLAMA_FTYPE_MOSTLY_Q3_K_M:   return "Q3_K - Medium";
        case LLAMA_FTYPE_MOSTLY_Q3_K_L:   return "Q3_K - Large";
        case LLAMA_FTYPE_MOSTLY_Q4_K_S:   return "Q4_K - Small";
        case LLAMA_FTYPE_MOSTLY_Q4_K_M:   return "Q4_K - Medium";
        case LLAMA_FTYPE_MOSTLY_Q5_K_S:   return "Q5_K - Small";
        case LLAMA_FTYPE_MOSTLY_Q5_K_M:   return "Q5_K - Medium";
        case LLAMA_FTYPE_MOSTLY_Q6_K:     return "Q6_K";
        case LLAMA_FTYPE_MOSTLY_TQ1_0:    return "TQ1_0 - 1.69 bpw ternary";
        case LLAMA_FTYPE_MOSTLY_TQ2_0:    return "TQ2_0 - 2.06 bpw ternary";
        case LLAMA_FTYPE_MOSTLY_IQ2_XXS:  return "IQ2_XXS - 2.0625 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ2_XS:   return "IQ2_XS - 2.3125 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ2_S:    return "IQ2_S - 2.5 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ2_M:    return "IQ2_M - 2.7 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ3_XS:   return "IQ3_XS - 3.3 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ3_XXS:  return "IQ3_XXS - 3.0625 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ1_S:    return "IQ1_S - 1.5625 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ1_M:    return "IQ1_M - 1.75 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ4_NL:   return "IQ4_NL - 4.5 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ4_XS:   return "IQ4_XS - 4.25 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ3_S:    return "IQ3_S - 3.4375 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ3_M:    return "IQ3_S mix - 3.66 bpw";

        default: return "unknown, may not work";
    }
}